

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void __thiscall
SFFile::SetInstrumentGenerators(SFFile *this,SFGenComposite *composite,int start,int stop)

{
  SFGenList *pSVar1;
  long lVar2;
  ulong uVar3;
  
  pSVar1 = this->InstrGenerators;
  lVar2 = 0;
  while ((stop - start != (int)lVar2 &&
         (((uVar3 = (ulong)pSVar1[start + lVar2].Oper, 0x3a < uVar3 ||
           ((0xa21e00001c4000U >> (uVar3 & 0x3f) & 1) != 0)) ||
          (*(anon_union_2_3_ea7ce7c6_for_SFGenList_1 *)
            (&composite->field_0 + GenDefs[uVar3].StructIndex) = pSVar1[start + lVar2].field_1,
          pSVar1[start + lVar2].Oper != 0x35))))) {
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

void SFFile::SetInstrumentGenerators(SFGenComposite *composite, int start, int stop)
{
	// Proceed from first to last; later generators override earlier ones.
	SFGenList *gen = &InstrGenerators[start];
	for (int i = stop - start; i != 0; --i, ++gen)
	{
		if (gen->Oper >= GEN_NumGenerators)
		{ // Unknown generator.
			continue;
		}
		if (GenDefs[gen->Oper].StructIndex >= sizeof(SFGenComposite)/2)
		{ // Generator is either unused or ignored.
			continue;
		}
		// Set the generator
		((WORD *)composite)[GenDefs[gen->Oper].StructIndex] = gen->uAmount;
		if (gen->Oper == GEN_sampleID)
		{ // Anything past sampleID is ignored.
			break;
		}
	}
}